

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int received_key_update(quicly_conn_t *conn,uint64_t newly_decrypted_key_phase)

{
  size_t len;
  long lVar1;
  _st_quicly_conn_public_t *p_Var2;
  uint64_t conn_00;
  int iVar3;
  ptls_cipher_suite_t *ppVar4;
  size_t *buf;
  undefined8 uStack_60;
  size_t local_58;
  undefined8 local_50;
  char *local_48 [2];
  size_t local_38;
  size_t _l;
  quicly_conn_t *_conn;
  st_quicly_application_space_t *space;
  uint64_t newly_decrypted_key_phase_local;
  quicly_conn_t *conn_local;
  
  _conn = (quicly_conn_t *)conn->application;
  space = (st_quicly_application_space_t *)newly_decrypted_key_phase;
  newly_decrypted_key_phase_local = (uint64_t)conn;
  if (newly_decrypted_key_phase <= *(ulong *)((_conn->super).local.cid_set.cids[2].cid.cid + 0x10))
  {
    uStack_60 = 0x14cac1;
    __assert_fail("space->cipher.ingress.key_phase.decrypted < newly_decrypted_key_phase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x5ea,"int received_key_update(quicly_conn_t *, uint64_t)");
  }
  if (newly_decrypted_key_phase <= *(ulong *)((_conn->super).local.cid_set.cids[2].cid.cid + 8)) {
    *(uint64_t *)((_conn->super).local.cid_set.cids[2].cid.cid + 0x10) = newly_decrypted_key_phase;
    buf = &local_58;
    _l = (size_t)conn;
    if (quicly_trace_fp != (FILE *)0x0) {
      uStack_60 = 0x14cb3d;
      iVar3 = ptls_skip_tracing((conn->crypto).tls);
      buf = &local_58;
      if (iVar3 == 0) {
        local_58 = _l;
        local_50 = *(undefined8 *)(newly_decrypted_key_phase_local + 0x9c0);
        local_48[0] = *(char **)((_conn->super).local.cid_set.cids[2].cid.cid + 0x10);
        uStack_60 = 0x14cb78;
        ppVar4 = ptls_get_cipher(*(ptls_t **)(newly_decrypted_key_phase_local + 0x8b0));
        len = ppVar4->hash->digest_size;
        lVar1 = -(len * 2 + 0x10 & 0xfffffffffffffff0);
        buf = (size_t *)((long)&local_58 + lVar1);
        p_Var2 = &_conn->super;
        local_38 = len;
        *(undefined8 *)((long)&uStack_60 + lVar1) = 0x14cbaf;
        local_48[1] = ptls_hexdump((char *)buf,&(p_Var2->local).cid_set.cids[1].cid,len);
        *(undefined8 *)((long)&uStack_60 + lVar1) = 0x14cbc8;
        QUICLY_CRYPTO_RECEIVE_KEY_UPDATE
                  (*(st_quicly_conn_t **)((long)&_l + lVar1),*(int64_t *)((long)&local_38 + lVar1),
                   *(uint64_t *)((long)local_48 + lVar1 + 8),*(char **)((long)local_48 + lVar1));
      }
    }
    conn_00 = newly_decrypted_key_phase_local;
    if ((_conn->super).local.cid_set._encryptor <
        *(quicly_cid_encryptor_t **)((_conn->super).local.cid_set.cids[2].cid.cid + 0x10)) {
      *(char *)((long)buf + -8) = -0x15;
      *(char *)((long)buf + -7) = -0x35;
      *(char *)((long)buf + -6) = '\x14';
      *(char *)((long)buf + -5) = '\0';
      *(char *)((long)buf + -4) = '\0';
      *(char *)((long)buf + -3) = '\0';
      *(char *)((long)buf + -2) = '\0';
      *(char *)((long)buf + -1) = '\0';
      conn_local._4_4_ = update_1rtt_egress_key((quicly_conn_t *)conn_00);
    }
    else {
      conn_local._4_4_ = 0;
    }
    return conn_local._4_4_;
  }
  uStack_60 = 0x14caf3;
  __assert_fail("newly_decrypted_key_phase <= space->cipher.ingress.key_phase.prepared",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x5eb,"int received_key_update(quicly_conn_t *, uint64_t)");
}

Assistant:

static int received_key_update(quicly_conn_t *conn, uint64_t newly_decrypted_key_phase)
{
    struct st_quicly_application_space_t *space = conn->application;

    assert(space->cipher.ingress.key_phase.decrypted < newly_decrypted_key_phase);
    assert(newly_decrypted_key_phase <= space->cipher.ingress.key_phase.prepared);

    space->cipher.ingress.key_phase.decrypted = newly_decrypted_key_phase;

    QUICLY_PROBE(CRYPTO_RECEIVE_KEY_UPDATE, conn, conn->stash.now, space->cipher.ingress.key_phase.decrypted,
                 QUICLY_PROBE_HEXDUMP(space->cipher.ingress.secret, ptls_get_cipher(conn->crypto.tls)->hash->digest_size));

    if (space->cipher.egress.key_phase < space->cipher.ingress.key_phase.decrypted) {
        return update_1rtt_egress_key(conn);
    } else {
        return 0;
    }
}